

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LZString.cpp
# Opt level: O2

wstring * __thiscall
lzstring::LZString::DeCompress_abi_cxx11_
          (wstring *__return_storage_ptr__,LZString *this,int length,int resetValue,
          GetNextCharFunc *func)

{
  wchar_t wVar1;
  wchar_t wVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  unsigned_long __val;
  int __args;
  uint uVar9;
  int iVar10;
  double dVar11;
  int local_ec;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  dict;
  wstring local_b8;
  int local_94;
  wstring entry;
  wstring w;
  wstring result;
  
  dict.
  super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  entry._M_dataplus._M_p = (pointer)&entry.field_2;
  entry._M_string_length = 0;
  entry.field_2._M_local_buf[0] = L'\0';
  result._M_dataplus._M_p = (pointer)&result.field_2;
  result._M_string_length = 0;
  result.field_2._M_local_buf[0] = L'\0';
  w._M_dataplus._M_p = (pointer)&w.field_2;
  w._M_string_length = 0;
  dict.
  super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  dict.
  super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  w.field_2._M_local_buf[0] = L'\0';
  local_94 = length;
  wVar1 = std::function<wchar_t_(int)>::operator()(func,0);
  for (__val = 0; __val != 3; __val = __val + 1) {
    std::__cxx11::to_wstring(&local_b8,__val);
    std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>::
    emplace_back<std::__cxx11::wstring>
              ((vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>> *)&dict,
               &local_b8);
    std::__cxx11::wstring::~wstring((wstring *)&local_b8);
  }
  uVar9 = 0;
  __args = 1;
  uVar5 = resetValue;
  for (uVar7 = 1; uVar7 != 4; uVar7 = uVar7 * 2) {
    if (uVar5 < 2) {
      wVar2 = std::function<wchar_t_(int)>::operator()(func,__args);
      __args = __args + 1;
      uVar4 = resetValue;
    }
    else {
      uVar4 = (int)uVar5 >> 1;
      wVar2 = wVar1;
    }
    uVar6 = 0;
    if (0 < (uVar5 & wVar1)) {
      uVar6 = uVar7;
    }
    uVar9 = uVar9 | uVar6;
    wVar1 = wVar2;
    uVar5 = uVar4;
  }
  if (uVar9 == 0) {
    for (iVar8 = 1; iVar8 != 0x100; iVar8 = iVar8 * 2) {
      if (uVar5 < 2) {
        wVar1 = std::function<wchar_t_(int)>::operator()(func,__args);
        __args = __args + 1;
        uVar5 = resetValue;
      }
      else {
        uVar5 = (int)uVar5 >> 1;
      }
    }
  }
  else {
    if (uVar9 == 2) {
      std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
                ((wstring *)__return_storage_ptr__,L"",(allocator<wchar_t> *)&local_b8);
      goto LAB_0010a9ac;
    }
    if (uVar9 == 1) {
      for (iVar8 = 1; iVar8 != 0x10000; iVar8 = iVar8 * 2) {
        if (uVar5 < 2) {
          wVar1 = std::function<wchar_t_(int)>::operator()(func,__args);
          __args = __args + 1;
          uVar5 = resetValue;
        }
        else {
          uVar5 = (int)uVar5 >> 1;
        }
      }
    }
  }
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::wstring::_M_construct((ulong)&local_b8,L'\x01');
  std::__cxx11::wstring::operator=((wstring *)&w,(wstring *)&local_b8);
  std::__cxx11::wstring::~wstring((wstring *)&local_b8);
  std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::push_back(&dict,&w);
  std::__cxx11::wstring::push_back((wchar_t)&result);
  iVar8 = 3;
  local_ec = 4;
  while (__args <= local_94) {
    dVar11 = ldexp(1.0,iVar8);
    uVar9 = 0;
    for (uVar7 = 1; uVar7 != (int)dVar11; uVar7 = uVar7 * 2) {
      if (uVar5 < 2) {
        wVar2 = std::function<wchar_t_(int)>::operator()(func,__args);
        __args = __args + 1;
        uVar4 = resetValue;
      }
      else {
        uVar4 = (int)uVar5 >> 1;
        wVar2 = wVar1;
      }
      uVar6 = 0;
      if (0 < (uVar5 & wVar1)) {
        uVar6 = uVar7;
      }
      uVar9 = uVar9 | uVar6;
      wVar1 = wVar2;
      uVar5 = uVar4;
    }
    if (uVar9 == 0) {
      for (iVar10 = 1; iVar10 != 0x100; iVar10 = iVar10 * 2) {
        if (uVar5 < 2) {
          wVar1 = std::function<wchar_t_(int)>::operator()(func,__args);
          __args = __args + 1;
          uVar5 = resetValue;
        }
        else {
          uVar5 = (int)uVar5 >> 1;
        }
      }
      uVar3 = (long)dict.
                    super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)dict.
                    super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::wstring::_M_construct((ulong)&local_b8,L'\x01');
      std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>::
      emplace_back<std::__cxx11::wstring>
                ((vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>> *)&dict,
                 &local_b8);
      std::__cxx11::wstring::~wstring((wstring *)&local_b8);
      local_ec = local_ec + -1;
      uVar9 = (uint)(uVar3 >> 5);
    }
    else if (uVar9 == 1) {
      for (iVar10 = 1; iVar10 != 0x10000; iVar10 = iVar10 * 2) {
        if (uVar5 < 2) {
          wVar1 = std::function<wchar_t_(int)>::operator()(func,__args);
          __args = __args + 1;
          uVar5 = resetValue;
        }
        else {
          uVar5 = (int)uVar5 >> 1;
        }
      }
      uVar3 = (long)dict.
                    super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)dict.
                    super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::wstring::_M_construct((ulong)&local_b8,L'\x01');
      std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>::
      emplace_back<std::__cxx11::wstring>
                ((vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>> *)&dict,
                 &local_b8);
      uVar9 = (uint)(uVar3 >> 5);
      std::__cxx11::wstring::~wstring((wstring *)&local_b8);
      local_ec = local_ec + -1;
    }
    else if (uVar9 == 2) {
      std::__cxx11::wstring::wstring((wstring *)__return_storage_ptr__,(wstring *)&result);
      goto LAB_0010a9ac;
    }
    if (local_ec == 0) {
      dVar11 = ldexp(1.0,iVar8);
      local_ec = (int)dVar11;
      iVar8 = iVar8 + 1;
    }
    uVar3 = (long)dict.
                  super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)dict.
                  super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5;
    if (uVar3 - 1 < (ulong)(long)(int)uVar9) {
      if (uVar3 != (long)(int)uVar9) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        __return_storage_ptr__->_M_string_length = 0;
        (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
        goto LAB_0010a9ac;
      }
      std::operator+(&local_b8,&w,*w._M_dataplus._M_p);
      std::__cxx11::wstring::operator=((wstring *)&entry,(wstring *)&local_b8);
      std::__cxx11::wstring::~wstring((wstring *)&local_b8);
    }
    else {
      std::__cxx11::wstring::_M_assign((wstring *)&entry);
    }
    std::__cxx11::wstring::append((wstring *)&result);
    std::operator+(&local_b8,&w,*entry._M_dataplus._M_p);
    std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>::
    emplace_back<std::__cxx11::wstring>
              ((vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>> *)&dict,
               &local_b8);
    std::__cxx11::wstring::~wstring((wstring *)&local_b8);
    std::__cxx11::wstring::_M_assign((wstring *)&w);
    local_ec = local_ec + -1;
    if (local_ec == 0) {
      dVar11 = ldexp(1.0,iVar8);
      local_ec = (int)dVar11;
      iVar8 = iVar8 + 1;
    }
  }
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)__return_storage_ptr__,L"",(allocator<wchar_t> *)&local_b8);
LAB_0010a9ac:
  std::__cxx11::wstring::~wstring((wstring *)&w);
  std::__cxx11::wstring::~wstring((wstring *)&result);
  std::__cxx11::wstring::~wstring((wstring *)&entry);
  std::
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  ::~vector(&dict);
  return __return_storage_ptr__;
}

Assistant:

std::wstring LZString::DeCompress(const int length, const int resetValue, GetNextCharFunc func)
{
	std::vector<std::wstring> dict;
	int enLargeIn = 4;
	int numBits = 3;
	std::wstring entry;
	std::wstring result;
	std::wstring w;
	int bits = 0, resb, maxpower, power;
	wchar_t c = '\0';

	wchar_t dataVal = func(0);
	int dataPosition = resetValue;
	int dataIndex = 1;

	for (size_t i = 0; i < 3; i++)
	{
		dict.push_back(std::to_wstring(i));
	}

	maxpower = (int)pow(2, 2);
	power = 1;
	while (power != maxpower)
	{
		resb = dataVal & dataPosition;
		dataPosition >>= 1;
		if (dataPosition == 0)
		{
			dataPosition = resetValue;
			dataVal = func(dataIndex++);
		}
		bits |= (resb > 0 ? 1 : 0) * power;
		power <<= 1;
	}

	switch (bits)
	{
	case 0:
		bits = 0;
		maxpower = (int)pow(2, 8);
		power = 1;
		while (power != maxpower)
		{
			resb = dataVal & dataPosition;
			dataPosition >>= 1;
			if (dataPosition == 0)
			{
				dataPosition = resetValue;
				dataVal = func(dataIndex++);
			}
			bits |= (resb > 0 ? 1 : 0) * power;
			power <<= 1;
		}
		c = (wchar_t)bits;
		break;
	case 1:
		bits = 0;
		maxpower = (int)pow(2, 16);
		power = 1;
		while (power != maxpower)
		{
			resb = dataVal & dataPosition;
			dataPosition >>= 1;
			if (dataPosition == 0)
			{
				dataPosition = resetValue;
				dataVal = func(dataIndex++);
			}
			bits |= (resb > 0 ? 1 : 0) * power;
			power <<= 1;
		}
		c = (wchar_t)bits;
		break;
	case 2:
		return L"";
	}
	w = std::wstring(1, c);
	dict.push_back(w);
	result.push_back(c);
	while (true)
	{
		if (dataIndex > length)
		{
			return L"";
		}

		bits = 0;
		maxpower = (int)pow(2, numBits);
		power = 1;
		while (power != maxpower)
		{
			resb = dataVal & dataPosition;
			dataPosition >>= 1;
			if (dataPosition == 0)
			{
				dataPosition = resetValue;
				dataVal = func(dataIndex++);
			}
			bits |= (resb > 0 ? 1 : 0) * power;
			power <<= 1;
		}

		int c2;
		switch (c2 = bits)
		{
		case (wchar_t)0:
			bits = 0;
			maxpower = (int)pow(2, 8);
			power = 1;
			while (power != maxpower)
			{
				resb = dataVal & dataPosition;
				dataPosition >>= 1;
				if (dataPosition == 0)
				{
					dataPosition = resetValue;
					dataVal = func(dataIndex++);
				}
				bits |= (resb > 0 ? 1 : 0) * power;
				power <<= 1;
			}

			c2 = dict.size();
			dict.push_back(std::wstring(1, (wchar_t)bits));
			enLargeIn--;
			break;
		case (wchar_t)1:
			bits = 0;
			maxpower = (int)pow(2, 16);
			power = 1;
			while (power != maxpower)
			{
				resb = dataVal & dataPosition;
				dataPosition >>= 1;
				if (dataPosition == 0)
				{
					dataPosition = resetValue;
					dataVal = func(dataIndex++);
				}
				bits |= (resb > 0 ? 1 : 0) * power;
				power <<= 1;
			}

			c2 = dict.size();
			dict.push_back(std::wstring(1, (wchar_t)bits));
			enLargeIn--;
			break;
		case (wchar_t)2:
			return result;
		}

		if (enLargeIn == 0)
		{
			enLargeIn = (int)pow(2, numBits);
			numBits++;
		}

		if (dict.size() - 1 >= c2)
		{
			entry = dict[c2];
		}
		else
		{
			if (c2 == dict.size())
			{
				entry = w + w[0];
			}
			else
			{
				return std::wstring();
			}
		}

		result += entry;

		// Add w+entry[0] to the dictionary
		dict.push_back(w + entry[0]);
		enLargeIn--;

		w = entry;

		if (enLargeIn == 0)
		{
			enLargeIn = (int)pow(2, numBits);
			numBits++;
		}
	}
}